

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O3

float rnnoise_process_frame(DenoiseState *st,float *out,float *in)

{
  int iVar1;
  double dVar2;
  long lVar3;
  float (*pafVar4) [22];
  float *pfVar5;
  int i;
  long lVar6;
  float (*pafVar7) [22];
  int k;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  opus_val16 oVar12;
  float fVar13;
  float fVar14;
  kiss_fft_cpx kVar15;
  float mindist;
  float fVar16;
  float fVar17;
  float dist;
  double dVar18;
  float fVar19;
  float vad_prob;
  int pitch_index;
  float *pre [1];
  float g [22];
  float Exp [22];
  float Ex [22];
  float Ep [22];
  float tmp [22];
  float pitch_buf [864];
  float gf [481];
  kiss_fft_cpx X [481];
  float x [480];
  kiss_fft_cpx x_1 [960];
  float p [960];
  kiss_fft_cpx P [960];
  float local_8a0c;
  double local_8a08;
  float local_8a00;
  float local_89fc;
  float local_89f8;
  int local_89f4;
  float *local_89f0;
  undefined8 local_89e8 [11];
  float afStack_8990 [6];
  float afStack_8978 [6];
  undefined8 local_8960;
  undefined8 uStack_8958;
  undefined8 local_8950;
  float local_8948;
  float local_8944;
  float local_8938 [24];
  float local_88d8 [24];
  float local_8878 [24];
  float local_8818 [24];
  float local_87b8 [2];
  undefined8 uStack_87b0;
  undefined8 local_87a8;
  float local_8758 [384];
  opus_val16 local_8158 [96];
  undefined1 local_7fd8 [1920];
  float local_7858 [484];
  kiss_fft_cpx local_70c8 [482];
  float local_61b8 [480];
  kiss_fft_cpx local_5a38;
  float afStack_5a30 [478];
  undefined1 local_52b8 [1928];
  float local_4b30 [958];
  kiss_fft_cpx local_3c38;
  float afStack_3c30 [1918];
  kiss_fft_cpx local_1e38 [961];
  
  bVar11 = 0;
  lVar6 = 0;
  memset(local_7858,0,0x784);
  local_7858[0] = 1.0;
  local_8a0c = 0.0;
  fVar14 = st->mem_hp_x[0];
  fVar17 = st->mem_hp_x[1];
  do {
    fVar13 = in[lVar6];
    fVar16 = fVar14 + fVar13;
    fVar19 = fVar16 * -0.996 + fVar13;
    fVar14 = (fVar16 * 1.99599 - (fVar13 + fVar13)) + fVar17;
    st->mem_hp_x[0] = fVar14;
    st->mem_hp_x[1] = fVar19;
    local_61b8[lVar6] = fVar16;
    lVar6 = lVar6 + 1;
    fVar17 = fVar19;
  } while (lVar6 != 0x1e0);
  memcpy(&local_5a38,st,0x780);
  memcpy(local_52b8,local_61b8,0x780);
  memcpy(st,local_61b8,0x780);
  apply_window(&local_5a38.r);
  forward_transform(local_70c8,&local_5a38.r);
  compute_band_energy(local_8878,local_70c8);
  pfVar5 = st->pitch_buf;
  memmove(pfVar5,st->pitch_buf + 0x1e0,0x1380);
  memcpy(st->pitch_buf + 0x4e0,local_61b8,0x780);
  local_89f0 = pfVar5;
  pitch_downsample(&local_89f0,local_8758,0x6c0,1);
  pitch_search(local_8158,local_8758,0x3c0,0x24c,&local_89f4);
  local_89f4 = 0x300 - local_89f4;
  oVar12 = remove_doubling(local_8758,0x300,0x3c,0x3c0,&local_89f4,st->last_period,st->last_gain);
  st->last_period = local_89f4;
  st->last_gain = oVar12;
  lVar6 = 0;
  do {
    (&local_3c38.r)[lVar6] = pfVar5[(0x300 - local_89f4) + (int)lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x3c0);
  apply_window(&local_3c38.r);
  forward_transform(local_1e38,&local_3c38.r);
  compute_band_energy(local_8818,local_1e38);
  compute_band_corr(local_88d8,local_70c8,local_1e38);
  lVar6 = 0;
  do {
    dVar2 = (double)(local_8878[lVar6] * local_8818[lVar6]) + 0.001;
    if (dVar2 < 0.0) {
      local_8a08 = (double)local_88d8[lVar6];
      dVar2 = sqrt(dVar2);
      dVar18 = local_8a08;
    }
    else {
      dVar2 = SQRT(dVar2);
      dVar18 = (double)local_88d8[lVar6];
    }
    local_88d8[lVar6] = (float)(dVar18 / dVar2);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x16);
  dct(local_87b8,local_88d8);
  uStack_8958 = uStack_87b0;
  local_8950 = local_87a8;
  local_8960 = CONCAT44(local_87b8[1] + -0.9,local_87b8[0] + -1.3);
  local_8948 = (float)(local_89f4 + -300) * 0.01;
  fVar13 = 0.0;
  fVar17 = -2.0;
  fVar14 = -2.0;
  lVar6 = 0;
  do {
    local_8a08 = (double)CONCAT44(local_8a08._4_4_,fVar13);
    local_89fc = local_8878[lVar6];
    local_8a00 = fVar14;
    local_89f8 = fVar17;
    dVar2 = log10((double)local_89fc + 0.01);
    fVar14 = local_8a00 + -1.5;
    fVar17 = fVar14;
    if (fVar14 <= (float)dVar2) {
      fVar17 = (float)dVar2;
    }
    fVar13 = local_89f8 + -7.0;
    if (local_89f8 + -7.0 <= fVar17) {
      fVar13 = fVar17;
    }
    local_8938[lVar6] = fVar13;
    if (fVar14 <= fVar13) {
      fVar14 = fVar13;
    }
    fVar17 = local_89f8;
    if (local_89f8 <= fVar13) {
      fVar17 = fVar13;
    }
    fVar13 = local_8a08._0_4_ + local_89fc;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x16);
  if (0.04 <= fVar13) {
    pfVar5 = (float *)local_89e8;
    dct(pfVar5,local_8938);
    local_89e8[0] =
         CONCAT44((float)((ulong)local_89e8[0] >> 0x20) + -4.0,(float)local_89e8[0] + -12.0);
    iVar1 = st->memid;
    lVar6 = (long)iVar1;
    uVar9 = (ulong)(iVar1 - 1);
    if (lVar6 < 1) {
      uVar9 = lVar6 + 7;
    }
    pafVar4 = st->cepstral_mem + lVar6;
    lVar3 = 0x16;
    pafVar7 = pafVar4;
    uVar10 = (ulong)(iVar1 - 2);
    if (lVar6 < 2) {
      uVar10 = lVar6 + 6;
    }
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      (*pafVar7)[0] = *pfVar5;
      pfVar5 = pfVar5 + (ulong)bVar11 * -2 + 1;
      pafVar7 = (float (*) [22])((long)pafVar7 + (ulong)bVar11 * -8 + 4);
    }
    st->memid = iVar1 + 1;
    lVar6 = 0;
    do {
      fVar14 = *(float *)((long)*pafVar4 + lVar6);
      fVar17 = *(float *)((long)st->cepstral_mem[uVar9] + lVar6);
      fVar13 = *(float *)((long)st->cepstral_mem[uVar10] + lVar6);
      *(float *)((long)local_89e8 + lVar6) = fVar14 + fVar17 + fVar13;
      *(float *)((long)afStack_8990 + lVar6) = fVar14 - fVar13;
      *(float *)((long)afStack_8978 + lVar6) = (fVar14 - (fVar17 + fVar17)) + fVar13;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    if (iVar1 + 1 == 8) {
      st->memid = 0;
    }
    fVar14 = 0.0;
    lVar6 = 0;
    pafVar4 = st->cepstral_mem;
    do {
      lVar3 = 0;
      pafVar7 = st->cepstral_mem;
      fVar17 = 1e+15;
      do {
        fVar13 = 0.0;
        lVar8 = 0;
        do {
          fVar19 = (*pafVar4)[lVar8] - (*pafVar7)[lVar8];
          fVar13 = fVar13 + fVar19 * fVar19;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x16);
        if ((lVar3 != lVar6) && (fVar13 <= fVar17)) {
          fVar17 = fVar13;
        }
        lVar3 = lVar3 + 1;
        pafVar7 = pafVar7 + 1;
      } while (lVar3 != 8);
      fVar14 = fVar14 + fVar17;
      lVar6 = lVar6 + 1;
      pafVar4 = pafVar4 + 1;
    } while (lVar6 != 8);
    local_8944 = fVar14 * 0.125 + -2.1;
    compute_rnn(&st->rnn,local_8938,&local_8a0c,(float *)local_89e8);
    pitch_filter(local_70c8,local_1e38,local_8878,local_8818,local_88d8,local_8938);
    lVar6 = 0;
    do {
      fVar17 = st->lastg[lVar6] * 0.6;
      fVar14 = local_8938[lVar6];
      if (local_8938[lVar6] <= fVar17) {
        fVar14 = fVar17;
      }
      local_8938[lVar6] = fVar14;
      st->lastg[lVar6] = fVar14;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x16);
    interp_band_gain(local_7858,local_8938);
    lVar6 = 0;
    do {
      kVar15.r = local_7858[lVar6] * local_70c8[lVar6].r;
      kVar15.i = local_7858[lVar6] * local_70c8[lVar6].i;
      local_70c8[lVar6] = kVar15;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1e1);
  }
  else {
    memset(local_89e8,0,0xa8);
  }
  check_init();
  memcpy(&local_5a38,local_70c8,0xf08);
  lVar6 = 0x1df;
  pfVar5 = local_4b30 + 1;
  do {
    pfVar5[-1] = (&local_5a38)[lVar6].r;
    *pfVar5 = -afStack_5a30[lVar6 * 2 + -1];
    pfVar5 = pfVar5 + 2;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  opus_fft_c(common.kfft,&local_5a38,&local_3c38);
  pfVar5 = local_8758;
  local_8758[0] = local_3c38.r * 960.0;
  lVar6 = 0x3bf;
  do {
    pfVar5 = pfVar5 + 1;
    *pfVar5 = (&local_3c38)[lVar6].r * 960.0;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  apply_window(local_8758);
  lVar6 = 0;
  do {
    out[lVar6] = local_8758[lVar6] + st->synthesis_mem[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1e0);
  memcpy(st->synthesis_mem,local_7fd8,0x780);
  return local_8a0c;
}

Assistant:

float rnnoise_process_frame(DenoiseState *st, float *out, const float *in) {
    int i;
    kiss_fft_cpx X[FREQ_SIZE];
    kiss_fft_cpx P[WINDOW_SIZE];
    float x[FRAME_SIZE];
    float Ex[NB_BANDS], Ep[NB_BANDS];
    float Exp[NB_BANDS];
    float features[NB_FEATURES];
    float g[NB_BANDS];
    float gf[FREQ_SIZE] = {1};
    float vad_prob = 0;
    int silence;
    static const float a_hp[2] = {-1.99599, 0.99600};
    static const float b_hp[2] = {-2, 1};
    biquad(x, st->mem_hp_x, in, b_hp, a_hp, FRAME_SIZE); // high pass 高通滤波 抑制50Hz或60Hz的电源干扰
    silence = compute_frame_features(st, X, P, Ex, Ep, Exp, features, x);

    if (!silence) { // 非静音帧
        compute_rnn(&st->rnn, g, &vad_prob, features);
        pitch_filter(X, P, Ex, Ep, Exp, g);
        for (i = 0; i < NB_BANDS; i++) {
            float alpha = .6f;
            g[i] = MAX16(g[i], alpha * st->lastg[i]);
            st->lastg[i] = g[i];
        }
        interp_band_gain(gf, g);
#if 1
        for (i = 0; i < FREQ_SIZE; i++) {
            X[i].r *= gf[i];
            X[i].i *= gf[i];
        }
#endif
    }
    frame_synthesis(st, out, X);
    return vad_prob;
}